

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int ref_singleton(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int local_30;
  int k;
  int i;
  int cf_local;
  int *edg_local;
  int *adj_local;
  coloring *c_local;
  saucy *s_local;
  
  iVar1 = c->lab[cf];
  for (local_30 = adj[iVar1]; local_30 != adj[iVar1 + 1]; local_30 = local_30 + 1) {
    data_mark(s,c,edg[local_30]);
  }
  iVar1 = refine_cell(s,c,ref_single_cell);
  return iVar1;
}

Assistant:

static int
ref_singleton(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, k = c->lab[cf];

    /* Find the cells we're connected to, and mark our neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        data_mark(s, c, edg[i]);
    }

    /* Refine the cells we're connected to */
    return refine_cell(s, c, ref_single_cell);
}